

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O2

void __thiscall cmCTestLaunchReporter::WriteXMLLabels(cmCTestLaunchReporter *this,cmXMLElement *e2)

{
  _Base_ptr p_Var1;
  cmXMLElement e3;
  allocator<char> local_51;
  cmXMLElement local_50;
  string local_48;
  
  LoadLabels(this);
  if ((this->Labels)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmXMLElement::Comment(e2,"Interested parties");
    cmXMLElement::cmXMLElement(&local_50,e2,"Labels");
    for (p_Var1 = (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->Labels)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Label",&local_51);
      cmXMLWriter::Element<std::__cxx11::string>
                (local_50.xmlwr,&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1));
      std::__cxx11::string::~string((string *)&local_48);
    }
    cmXMLElement::~cmXMLElement(&local_50);
  }
  return;
}

Assistant:

void cmCTestLaunchReporter::WriteXMLLabels(cmXMLElement& e2)
{
  this->LoadLabels();
  if (!this->Labels.empty()) {
    e2.Comment("Interested parties");
    cmXMLElement e3(e2, "Labels");
    for (std::string const& label : this->Labels) {
      e3.Element("Label", label);
    }
  }
}